

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
          (AnimatedPerspectiveCameraNode *this,
          Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *other,AffineSpace3fa *space,
          string *id)

{
  pointer pcVar1;
  pointer pRVar2;
  PerspectiveCameraNode *pPVar3;
  PerspectiveCameraNode *this_00;
  ulong uVar4;
  string local_70;
  string local_50;
  
  pcVar1 = (id->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + id->_M_string_length);
  Node::Node((Node *)this,&local_50);
  (this->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002bf468;
  *(undefined8 *)&(this->super_PerspectiveCameraNode).data.from.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->super_PerspectiveCameraNode).data.from.field_0 + 8) = 0;
  *(undefined8 *)&(this->super_PerspectiveCameraNode).data.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_PerspectiveCameraNode).data.to.field_0 + 8) = 0;
  *(undefined8 *)&(this->super_PerspectiveCameraNode).data.up.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->super_PerspectiveCameraNode).data.up.field_0 + 8) = 0;
  (this->super_PerspectiveCameraNode).data.fov = 30.0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedPerspectiveCameraNode_002bf518;
  this->time_range = other->ptr->time_range;
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::resize(&this->cameras,
           (long)(other->ptr->cameras).
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(other->ptr->cameras).
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((other->ptr->cameras).
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (other->ptr->cameras).
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      this_00 = (PerspectiveCameraNode *)alignedMalloc(0xb0,0x10);
      pRVar2 = (other->ptr->cameras).
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      PerspectiveCameraNode::PerspectiveCameraNode(this_00,pRVar2 + uVar4,space,&local_70);
      pRVar2 = (this->cameras).
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
      pPVar3 = pRVar2[uVar4].ptr;
      if (pPVar3 != (PerspectiveCameraNode *)0x0) {
        (**(code **)((long)(pPVar3->super_Node).super_RefCount._vptr_RefCount + 0x18))();
      }
      pRVar2[uVar4].ptr = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(other->ptr->cameras).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(other->ptr->cameras).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

AnimatedPerspectiveCameraNode (const Ref<AnimatedPerspectiveCameraNode>& other, const AffineSpace3fa& space, const std::string& id)
        : PerspectiveCameraNode(id), time_range(other->time_range)
      {
        cameras.resize(other->size());
        for (size_t i=0; i<other->size(); i++)
          cameras[i] = new PerspectiveCameraNode(other->cameras[i],space);
      }